

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::calculateProblemRanges
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  type_conflict5 tVar1;
  double *pdVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  bool *pbVar6;
  long lVar7;
  int *piVar8;
  bool *pbVar9;
  int *piVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  undefined8 *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  multiprecision *pmVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  long lVar16;
  byte bVar17;
  ulong uVar18;
  long local_7c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  abslow;
  cpp_dec_float<200U,_int,_void> local_730;
  cpp_dec_float<200U,_int,_void> local_6b0;
  cpp_dec_float<200U,_int,_void> local_630;
  cpp_dec_float<200U,_int,_void> local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absupp;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absobj;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  multiprecision local_330 [112];
  undefined4 local_2c0;
  undefined1 local_2bc;
  undefined8 local_2b8;
  multiprecision local_2b0 [112];
  undefined4 local_240;
  undefined1 local_23c;
  undefined8 local_238;
  multiprecision local_230 [112];
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  multiprecision local_1b0 [112];
  undefined4 local_140;
  undefined1 local_13c;
  undefined8 local_138;
  cpp_dec_float<200U,_int,_void> local_130;
  multiprecision local_b0 [128];
  
  bVar17 = 0;
  pdVar2 = (double *)infinity();
  local_7c8 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_3b0,*pdVar2,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_430,0.0,(type *)0x0);
  pdVar2 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_5b0,*pdVar2,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_630,0.0,(type *)0x0);
  pdVar2 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_6b0,*pdVar2,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_730,0.0,(type *)0x0);
  lVar16 = 0x78;
  for (; lVar5 = 0x1c,
      local_7c8 <
      (this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum; local_7c8 = local_7c8 + 1) {
    puVar3 = (undefined8 *)
             ((long)&(((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar16);
    puVar12 = puVar3 + -0xf;
    pmVar14 = local_1b0;
    for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined4 *)pmVar14 = *(undefined4 *)puVar12;
      puVar12 = (undefined8 *)((long)puVar12 + (ulong)bVar17 * -8 + 4);
      pmVar14 = pmVar14 + (ulong)bVar17 * -8 + 4;
    }
    local_140 = *(undefined4 *)(puVar3 + -1);
    local_13c = *(undefined1 *)((long)puVar3 + -4);
    local_138 = *puVar3;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&abslow,local_1b0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_1b0);
    puVar3 = (undefined8 *)
             ((long)&(((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar16);
    puVar12 = puVar3 + -0xf;
    pmVar14 = local_230;
    for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined4 *)pmVar14 = *(undefined4 *)puVar12;
      puVar12 = (undefined8 *)((long)puVar12 + (ulong)bVar17 * -8 + 4);
      pmVar14 = pmVar14 + (ulong)bVar17 * -8 + 4;
    }
    local_1c0 = *(undefined4 *)(puVar3 + -1);
    local_1bc = *(undefined1 *)((long)puVar3 + -4);
    local_1b8 = *puVar3;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&absupp,local_230,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_230);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)local_b0,
          &this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,(int)local_7c8);
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&absobj,local_b0,arg);
    pdVar2 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_130,*pdVar2,(type *)0x0);
    tVar1 = boost::multiprecision::operator<
                      (&abslow,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_130);
    if (tVar1) {
      pcVar11 = &local_5b0;
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar11,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&abslow.m_backend);
      pcVar13 = &abslow.m_backend;
      if (tVar1) {
        pcVar13 = pcVar11;
      }
      for (; lVar5 != 0; lVar5 = lVar5 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      piVar10 = &abslow.m_backend.exp;
      piVar8 = piVar10;
      if (tVar1) {
        piVar8 = &local_5b0.exp;
      }
      local_5b0.exp = *piVar8;
      pbVar6 = &abslow.m_backend.neg;
      pbVar9 = pbVar6;
      if (tVar1) {
        pbVar9 = &local_5b0.neg;
      }
      local_5b0.neg = *pbVar9;
      uVar18 = CONCAT44((int)((uint)tVar1 << 0x1f) >> 0x1f,(int)((uint)tVar1 << 0x1f) >> 0x1f);
      local_5b0._120_8_ = ~uVar18 & abslow.m_backend._120_8_ | local_5b0._120_8_ & uVar18;
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_630,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&abslow.m_backend);
      pcVar11 = &abslow.m_backend;
      if (tVar1) {
        pcVar11 = &local_630;
      }
      pcVar13 = &local_630;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      if (tVar1) {
        piVar10 = &local_630.exp;
      }
      local_630.exp = *piVar10;
      if (tVar1) {
        pbVar6 = &local_630.neg;
      }
      local_630.neg = *pbVar6;
      uVar18 = CONCAT44((int)((uint)tVar1 << 0x1f) >> 0x1f,(int)((uint)tVar1 << 0x1f) >> 0x1f);
      local_630._120_8_ = ~uVar18 & abslow.m_backend._120_8_ | local_630._120_8_ & uVar18;
    }
    pdVar2 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_130,*pdVar2,(type *)0x0);
    tVar1 = boost::multiprecision::operator<
                      (&absupp,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_130);
    if (tVar1) {
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_5b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&absupp.m_backend);
      pcVar11 = &absupp.m_backend;
      if (tVar1) {
        pcVar11 = &local_5b0;
      }
      pcVar13 = &local_5b0;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      piVar10 = &absupp.m_backend.exp;
      piVar8 = piVar10;
      if (tVar1) {
        piVar8 = &local_5b0.exp;
      }
      local_5b0.exp = *piVar8;
      pbVar6 = &absupp.m_backend.neg;
      pbVar9 = pbVar6;
      if (tVar1) {
        pbVar9 = &local_5b0.neg;
      }
      local_5b0.neg = *pbVar9;
      uVar18 = CONCAT44((int)((uint)tVar1 << 0x1f) >> 0x1f,(int)((uint)tVar1 << 0x1f) >> 0x1f);
      local_5b0._120_8_ = ~uVar18 & absupp.m_backend._120_8_ | local_5b0._120_8_ & uVar18;
      pcVar11 = &local_630;
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar11,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&absupp.m_backend);
      lVar5 = 0x1c;
      pcVar13 = &absupp.m_backend;
      if (tVar1) {
        pcVar13 = pcVar11;
      }
      for (; lVar5 != 0; lVar5 = lVar5 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      if (tVar1) {
        piVar10 = &local_630.exp;
      }
      local_630.exp = *piVar10;
      if (tVar1) {
        pbVar6 = &local_630.neg;
      }
      local_630.neg = *pbVar6;
      uVar18 = CONCAT44((int)((uint)tVar1 << 0x1f) >> 0x1f,(int)((uint)tVar1 << 0x1f) >> 0x1f);
      local_630._120_8_ = ~uVar18 & absupp.m_backend._120_8_ | local_630._120_8_ & uVar18;
    }
    lVar4 = 0x1c;
    pcVar11 = &local_3b0;
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pcVar11,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&absobj.m_backend);
    lVar5 = lVar4;
    pcVar13 = &absobj.m_backend;
    if (tVar1) {
      pcVar13 = pcVar11;
    }
    for (; lVar5 != 0; lVar5 = lVar5 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0] =
           (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    piVar10 = &absobj.m_backend.exp;
    piVar8 = piVar10;
    if (tVar1) {
      piVar8 = &local_3b0.exp;
    }
    local_3b0.exp = *piVar8;
    pbVar6 = &absobj.m_backend.neg;
    pbVar9 = pbVar6;
    if (tVar1) {
      pbVar9 = &local_3b0.neg;
    }
    local_3b0.neg = *pbVar9;
    uVar18 = CONCAT44((int)((uint)tVar1 << 0x1f) >> 0x1f,(int)((uint)tVar1 << 0x1f) >> 0x1f);
    local_3b0._120_8_ = ~uVar18 & absobj.m_backend._120_8_ | local_3b0._120_8_ & uVar18;
    pcVar11 = &local_430;
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pcVar11,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&absobj.m_backend);
    pcVar13 = &absobj.m_backend;
    if (tVar1) {
      pcVar13 = pcVar11;
    }
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0] =
           (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
    }
    if (tVar1) {
      piVar10 = &local_430.exp;
    }
    if (tVar1) {
      pbVar6 = &local_430.neg;
    }
    local_430.exp = *piVar10;
    local_430.neg = *pbVar6;
    uVar18 = CONCAT44((int)((uint)tVar1 << 0x1f) >> 0x1f,(int)((uint)tVar1 << 0x1f) >> 0x1f);
    local_430._120_8_ = ~uVar18 & absobj.m_backend._120_8_ | local_430._120_8_ & uVar18;
    lVar16 = lVar16 + 0x80;
  }
  lVar16 = 0x78;
  for (lVar5 = 0;
      lVar5 < (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum; lVar5 = lVar5 + 1) {
    puVar3 = (undefined8 *)
             ((long)&(((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar16);
    lVar4 = 0x1c;
    puVar12 = puVar3 + -0xf;
    pmVar14 = local_2b0;
    for (lVar7 = lVar4; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined4 *)pmVar14 = *(undefined4 *)puVar12;
      puVar12 = (undefined8 *)((long)puVar12 + (ulong)bVar17 * -8 + 4);
      pmVar14 = pmVar14 + (ulong)bVar17 * -8 + 4;
    }
    local_240 = *(undefined4 *)(puVar3 + -1);
    local_23c = *(undefined1 *)((long)puVar3 + -4);
    local_238 = *puVar3;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&abslow,local_2b0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_2b0);
    puVar3 = (undefined8 *)
             ((long)&(((this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar16);
    puVar12 = puVar3 + -0xf;
    pmVar14 = local_330;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined4 *)pmVar14 = *(undefined4 *)puVar12;
      puVar12 = (undefined8 *)((long)puVar12 + (ulong)bVar17 * -8 + 4);
      pmVar14 = pmVar14 + (ulong)bVar17 * -8 + 4;
    }
    local_2c0 = *(undefined4 *)(puVar3 + -1);
    local_2bc = *(undefined1 *)((long)puVar3 + -4);
    local_2b8 = *puVar3;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&absupp,local_330,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_330);
    pdVar2 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&absobj.m_backend,*pdVar2,(type *)0x0);
    tVar1 = boost::multiprecision::operator>
                      (&abslow,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&absobj.m_backend);
    if (tVar1) {
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_6b0,&abslow);
      pcVar11 = &abslow.m_backend;
      if (tVar1) {
        pcVar11 = &local_6b0;
      }
      lVar4 = 0x1c;
      pcVar13 = &local_6b0;
      for (lVar7 = lVar4; lVar7 != 0; lVar7 = lVar7 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      piVar10 = &abslow.m_backend.exp;
      piVar8 = piVar10;
      if (tVar1) {
        piVar8 = &local_6b0.exp;
      }
      local_6b0.exp = *piVar8;
      pbVar6 = &abslow.m_backend.neg;
      pbVar9 = pbVar6;
      if (tVar1) {
        pbVar9 = &local_6b0.neg;
      }
      local_6b0.neg = *pbVar9;
      uVar18 = CONCAT44((int)((uint)tVar1 << 0x1f) >> 0x1f,(int)((uint)tVar1 << 0x1f) >> 0x1f);
      local_6b0._120_8_ = ~uVar18 & abslow.m_backend._120_8_ | local_6b0._120_8_ & uVar18;
      pcVar11 = &local_730;
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar11,&abslow);
      pcVar13 = &abslow.m_backend;
      if (tVar1) {
        pcVar13 = pcVar11;
      }
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      if (tVar1) {
        piVar10 = &local_730.exp;
      }
      local_730.exp = *piVar10;
      if (tVar1) {
        pbVar6 = &local_730.neg;
      }
      local_730.neg = *pbVar6;
      uVar18 = CONCAT44((int)((uint)tVar1 << 0x1f) >> 0x1f,(int)((uint)tVar1 << 0x1f) >> 0x1f);
      local_730._120_8_ = ~uVar18 & abslow.m_backend._120_8_ | local_730._120_8_ & uVar18;
    }
    pdVar2 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&absobj.m_backend,*pdVar2,(type *)0x0);
    tVar1 = boost::multiprecision::operator<
                      (&absupp,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&absobj.m_backend);
    if (tVar1) {
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_6b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&absupp.m_backend);
      pcVar11 = &absupp.m_backend;
      if (tVar1) {
        pcVar11 = &local_6b0;
      }
      lVar4 = 0x1c;
      pcVar13 = &local_6b0;
      for (lVar7 = lVar4; lVar7 != 0; lVar7 = lVar7 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      piVar10 = &absupp.m_backend.exp;
      piVar8 = piVar10;
      if (tVar1) {
        piVar8 = &local_6b0.exp;
      }
      local_6b0.exp = *piVar8;
      pbVar6 = &absupp.m_backend.neg;
      pbVar9 = pbVar6;
      if (tVar1) {
        pbVar9 = &local_6b0.neg;
      }
      local_6b0.neg = *pbVar9;
      uVar18 = CONCAT44((int)((uint)tVar1 << 0x1f) >> 0x1f,(int)((uint)tVar1 << 0x1f) >> 0x1f);
      local_6b0._120_8_ = ~uVar18 & absupp.m_backend._120_8_ | local_6b0._120_8_ & uVar18;
      pcVar11 = &local_730;
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar11,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&absupp.m_backend);
      pcVar13 = &absupp.m_backend;
      if (tVar1) {
        pcVar13 = pcVar11;
      }
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
      }
      if (tVar1) {
        piVar10 = &local_730.exp;
      }
      local_730.exp = *piVar10;
      if (tVar1) {
        pbVar6 = &local_730.neg;
      }
      local_730.neg = *pbVar6;
      uVar18 = CONCAT44((int)((uint)tVar1 << 0x1f) >> 0x1f,(int)((uint)tVar1 << 0x1f) >> 0x1f);
      local_730._120_8_ = ~uVar18 & absupp.m_backend._120_8_ | local_730._120_8_ & uVar18;
    }
    lVar16 = lVar16 + 0x80;
  }
  abslow.m_backend.fpclass = cpp_dec_float_finite;
  abslow.m_backend.prec_elem = 0x1c;
  abslow.m_backend.data._M_elems[0] = 0;
  abslow.m_backend.data._M_elems[1] = 0;
  abslow.m_backend.data._M_elems[2] = 0;
  abslow.m_backend.data._M_elems[3] = 0;
  abslow.m_backend.data._M_elems[4] = 0;
  abslow.m_backend.data._M_elems[5] = 0;
  abslow.m_backend.data._M_elems[6] = 0;
  abslow.m_backend.data._M_elems[7] = 0;
  abslow.m_backend.data._M_elems[8] = 0;
  abslow.m_backend.data._M_elems[9] = 0;
  abslow.m_backend.data._M_elems[10] = 0;
  abslow.m_backend.data._M_elems[0xb] = 0;
  abslow.m_backend.data._M_elems[0xc] = 0;
  abslow.m_backend.data._M_elems[0xd] = 0;
  abslow.m_backend.data._M_elems[0xe] = 0;
  abslow.m_backend.data._M_elems[0xf] = 0;
  abslow.m_backend.data._M_elems[0x10] = 0;
  abslow.m_backend.data._M_elems[0x11] = 0;
  abslow.m_backend.data._M_elems[0x12] = 0;
  abslow.m_backend.data._M_elems[0x13] = 0;
  abslow.m_backend.data._M_elems[0x14] = 0;
  abslow.m_backend.data._M_elems[0x15] = 0;
  abslow.m_backend.data._M_elems[0x16] = 0;
  abslow.m_backend.data._M_elems[0x17] = 0;
  abslow.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  abslow.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  abslow.m_backend.exp = 0;
  abslow.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&abslow.m_backend,&local_630,&local_5b0);
  lVar16 = 0x1c;
  pcVar11 = &abslow.m_backend;
  pnVar15 = &this->boundrange;
  for (lVar5 = lVar16; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar15->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4);
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + (ulong)bVar17 * -8 + 4);
  }
  (this->boundrange).m_backend.exp = abslow.m_backend.exp;
  (this->boundrange).m_backend.neg = abslow.m_backend.neg;
  (this->boundrange).m_backend.fpclass = abslow.m_backend.fpclass;
  (this->boundrange).m_backend.prec_elem = abslow.m_backend.prec_elem;
  abslow.m_backend.fpclass = cpp_dec_float_finite;
  abslow.m_backend.prec_elem = 0x1c;
  abslow.m_backend.data._M_elems[0] = 0;
  abslow.m_backend.data._M_elems[1] = 0;
  abslow.m_backend.data._M_elems[2] = 0;
  abslow.m_backend.data._M_elems[3] = 0;
  abslow.m_backend.data._M_elems[4] = 0;
  abslow.m_backend.data._M_elems[5] = 0;
  abslow.m_backend.data._M_elems[6] = 0;
  abslow.m_backend.data._M_elems[7] = 0;
  abslow.m_backend.data._M_elems[8] = 0;
  abslow.m_backend.data._M_elems[9] = 0;
  abslow.m_backend.data._M_elems[10] = 0;
  abslow.m_backend.data._M_elems[0xb] = 0;
  abslow.m_backend.data._M_elems[0xc] = 0;
  abslow.m_backend.data._M_elems[0xd] = 0;
  abslow.m_backend.data._M_elems[0xe] = 0;
  abslow.m_backend.data._M_elems[0xf] = 0;
  abslow.m_backend.data._M_elems[0x10] = 0;
  abslow.m_backend.data._M_elems[0x11] = 0;
  abslow.m_backend.data._M_elems[0x12] = 0;
  abslow.m_backend.data._M_elems[0x13] = 0;
  abslow.m_backend.data._M_elems[0x14] = 0;
  abslow.m_backend.data._M_elems[0x15] = 0;
  abslow.m_backend.data._M_elems[0x16] = 0;
  abslow.m_backend.data._M_elems[0x17] = 0;
  abslow.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  abslow.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  abslow.m_backend.exp = 0;
  abslow.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&abslow.m_backend,&local_730,&local_6b0);
  pcVar11 = &abslow.m_backend;
  pnVar15 = &this->siderange;
  for (lVar5 = lVar16; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar15->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4);
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + (ulong)bVar17 * -8 + 4);
  }
  (this->siderange).m_backend.exp = abslow.m_backend.exp;
  (this->siderange).m_backend.neg = abslow.m_backend.neg;
  (this->siderange).m_backend.fpclass = abslow.m_backend.fpclass;
  (this->siderange).m_backend.prec_elem = abslow.m_backend.prec_elem;
  abslow.m_backend.fpclass = cpp_dec_float_finite;
  abslow.m_backend.prec_elem = 0x1c;
  abslow.m_backend.data._M_elems[0] = 0;
  abslow.m_backend.data._M_elems[1] = 0;
  abslow.m_backend.data._M_elems[2] = 0;
  abslow.m_backend.data._M_elems[3] = 0;
  abslow.m_backend.data._M_elems[4] = 0;
  abslow.m_backend.data._M_elems[5] = 0;
  abslow.m_backend.data._M_elems[6] = 0;
  abslow.m_backend.data._M_elems[7] = 0;
  abslow.m_backend.data._M_elems[8] = 0;
  abslow.m_backend.data._M_elems[9] = 0;
  abslow.m_backend.data._M_elems[10] = 0;
  abslow.m_backend.data._M_elems[0xb] = 0;
  abslow.m_backend.data._M_elems[0xc] = 0;
  abslow.m_backend.data._M_elems[0xd] = 0;
  abslow.m_backend.data._M_elems[0xe] = 0;
  abslow.m_backend.data._M_elems[0xf] = 0;
  abslow.m_backend.data._M_elems[0x10] = 0;
  abslow.m_backend.data._M_elems[0x11] = 0;
  abslow.m_backend.data._M_elems[0x12] = 0;
  abslow.m_backend.data._M_elems[0x13] = 0;
  abslow.m_backend.data._M_elems[0x14] = 0;
  abslow.m_backend.data._M_elems[0x15] = 0;
  abslow.m_backend.data._M_elems[0x16] = 0;
  abslow.m_backend.data._M_elems[0x17] = 0;
  abslow.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  abslow.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  abslow.m_backend.exp = 0;
  abslow.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&abslow.m_backend,&local_430,&local_3b0);
  pcVar11 = &abslow.m_backend;
  pnVar15 = &this->objrange;
  for (; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pnVar15->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4);
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + (ulong)bVar17 * -8 + 4);
  }
  (this->objrange).m_backend.exp = abslow.m_backend.exp;
  (this->objrange).m_backend.neg = abslow.m_backend.neg;
  (this->objrange).m_backend.fpclass = abslow.m_backend.fpclass;
  (this->objrange).m_backend.prec_elem = abslow.m_backend.prec_elem;
  return;
}

Assistant:

void SPxSolverBase<R>::calculateProblemRanges()
{
   // only collect absolute values
   R minobj = R(infinity);
   R maxobj = 0.0;
   R minbound = R(infinity);
   R maxbound = 0.0;
   R minside = R(infinity);
   R maxside = 0.0;

   // get min and max absolute values of bounds and objective
   for(int j = 0; j < this->nCols(); ++j)
   {
      R abslow = spxAbs(this->lower(j));
      R absupp = spxAbs(this->lower(j));
      R absobj = spxAbs(this->obj(j));

      if(abslow < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, abslow);
         maxbound = SOPLEX_MAX(maxbound, abslow);
      }

      if(absupp < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, absupp);
         maxbound = SOPLEX_MAX(maxbound, absupp);
      }

      minobj = SOPLEX_MIN(minobj, absobj);
      maxobj = SOPLEX_MAX(maxobj, absobj);
   }

   // get min and max absoute values of sides
   for(int i = 0; i < this->nRows(); ++i)
   {
      R abslhs = spxAbs(this->lhs(i));
      R absrhs = spxAbs(this->rhs(i));

      if(abslhs > R(infinity))
      {
         minside = SOPLEX_MIN(minside, abslhs);
         maxside = SOPLEX_MAX(maxside, abslhs);
      }

      if(absrhs < R(infinity))
      {
         minside = SOPLEX_MIN(minside, absrhs);
         maxside = SOPLEX_MAX(maxside, absrhs);
      }
   }

   boundrange = maxbound - minbound;
   siderange = maxside - minside;
   objrange = maxobj - minobj;
}